

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::EmbedField::~EmbedField(EmbedField *this)

{
  EmbedField *this_local;
  
  omittable_field<bool>::~omittable_field(&this->display_inline);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&this->value);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&this->name);
  return;
}

Assistant:

EmbedField(
        field<std::string> name = uninitialized,
        field<std::string> value = uninitialized,
        omittable_field<bool> display_inline = omitted
    ):
        name(name),
        value(value),
        display_inline(display_inline)
    {}